

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printHelp(void)

{
  ostream *poVar1;
  
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_7c03);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Usage:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "\tscript2000 [--filename] filname [--tokenizer_debug] [--table_debug] [--parser_debug] [--ast] [--debug]"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void printHelp()
{
	std::cout << std::endl << "script2000 interpreter ᕙ༼ຈل͜ຈ༽ᕗ" << std::endl << std::endl
			  << "Usage:" << std::endl
			  << "\tscript2000 [--filename] filname [--tokenizer_debug] [--table_debug] [--parser_debug] [--ast] [--debug]" << std::endl << std::endl;
}